

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall stackjit::ExecutionEngine::~ExecutionEngine(ExecutionEngine *this)

{
  ManagedFunction *pMVar1;
  __node_base *p_Var2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
  func;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
  pStack_48;
  
  p_Var2 = &(this->mLoadedFunctions)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
    ::pair(&pStack_48,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>
            *)(p_Var2 + 1));
    pMVar1 = pStack_48.second;
    if (pStack_48.second != (ManagedFunction *)0x0) {
      ManagedFunction::~ManagedFunction(pStack_48.second);
    }
    operator_delete(pMVar1);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::ManagedFunction_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mLoadedFunctions)._M_h);
  ImageContainer::~ImageContainer(&this->mImageContainer);
  std::__cxx11::string::~string((string *)&this->mBaseDir);
  CallStack::~CallStack(&this->mCallStack);
  JITCompiler::~JITCompiler(&this->mJIT);
  return;
}

Assistant:

ExecutionEngine::~ExecutionEngine() {
		for (auto func : mLoadedFunctions) {
			delete func.second;
		}
	}